

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seq.hpp
# Opt level: O3

Maybe<char> __thiscall rc::Seq<char>::next(Seq<char> *this)

{
  long *in_RSI;
  
  if ((undefined8 *)*in_RSI == (undefined8 *)0x0) {
    *(undefined1 *)
     ((long)&(this->m_impl)._M_t.
             super___uniq_ptr_impl<rc::Seq<char>::ISeqImpl,_std::default_delete<rc::Seq<char>::ISeqImpl>_>
             ._M_t.
             super__Tuple_impl<0UL,_rc::Seq<char>::ISeqImpl_*,_std::default_delete<rc::Seq<char>::ISeqImpl>_>
             .super__Head_base<0UL,_rc::Seq<char>::ISeqImpl_*,_false>._M_head_impl + 1) = 0;
  }
  else {
    (*(code *)**(undefined8 **)*in_RSI)(this);
  }
  return SUB82(this,0);
}

Assistant:

Maybe<T> Seq<T>::next() noexcept {
  try {
    return m_impl ? m_impl->next() : Nothing;
  } catch (...) {
    m_impl.reset();
    return Nothing;
  }
}